

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_interval_heap.cpp
# Opt level: O2

void __thiscall interval_heap_sorting::test_method(interval_heap_sorting *this)

{
  int iVar1;
  const_string *msg;
  value_expr<bool> local_b9;
  vector<int,_std::allocator<int>_> heap_arr;
  vector<int,_std::allocator<int>_> original;
  assertion_result local_88;
  lazy_ostream local_70;
  undefined1 *local_60;
  char **local_58;
  const_string local_50;
  char *local_40;
  char *local_38;
  const_string local_30;
  const_string local_20;
  
  heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar1 = 0;
  while (local_70._vptr_lazy_ostream =
              (_func_int **)CONCAT44(local_70._vptr_lazy_ostream._4_4_,iVar1), iVar1 < 0x41b) {
    std::vector<int,_std::allocator<int>_>::push_back(&heap_arr,(value_type_conflict2 *)&local_70);
    iVar1 = (int)local_70._vptr_lazy_ostream + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&original,&heap_arr);
  boost::heap::
  make_interval_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  boost::heap::
  sort_interval_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
            (original.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,original.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  local_20.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_interval_heap.cpp"
  ;
  local_20.m_end = "";
  msg = &local_30;
  local_30.m_begin = "";
  local_30.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_20,0x4f,msg);
  local_b9.m_value =
       std::__equal<true>::equal<int>
                 ((__equal<true> *)
                  heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  heap_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
                  original.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,(int *)msg);
  boost::test_tools::assertion::value_expr<bool>::evaluate(&local_88,&local_b9,false);
  local_58 = &local_40;
  local_40 = "std::equal(heap_arr.begin(), heap_arr.end(), original.begin())";
  local_38 = "";
  local_70.m_empty = false;
  local_70._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d8cd0;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_interval_heap.cpp"
  ;
  local_50.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_88,&local_70,&local_50,0x4f,REQUIRE,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&original.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&heap_arr.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( interval_heap_sorting )
{
  using namespace boost::heap;
  std::vector<int> heap_arr;
  for (int i = 0; i < 1051; ++i)
    heap_arr.push_back(i);
  std::vector<int> original = heap_arr;
  make_interval_heap(heap_arr.begin(), heap_arr.end(), std::less<int>());

  sort_interval_heap(heap_arr.begin(), heap_arr.end(), std::less<int>());
  std::sort(original.begin(), original.end(), std::less<int>());
  BOOST_TEST_REQUIRE(std::equal(heap_arr.begin(), heap_arr.end(), original.begin()));
}